

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVdfg_stone INT_EVdfg_create_source_stone(EVdfg dfg,char *source_name)

{
  size_t sVar1;
  char *__dest;
  EVdfg_stone p_Var2;
  
  sVar1 = strlen(source_name);
  __dest = (char *)INT_CMmalloc(sVar1 + 8);
  builtin_strncpy(__dest,"source:",8);
  strcat(__dest,source_name);
  p_Var2 = INT_EVdfg_create_stone(dfg,__dest);
  free(__dest);
  return p_Var2;
}

Assistant:

EVdfg_stone
INT_EVdfg_create_source_stone(EVdfg dfg, char *source_name)
{
    EVdfg_stone tmp;
    size_t len = strlen(source_name) + strlen("source:");
    char *act = malloc(len + 1);
    strcpy(&act[0], "source:");
    strcat(&act[0], source_name);
    tmp = INT_EVdfg_create_stone(dfg, &act[0]);
    free(act);
    return tmp;
}